

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix-ops.cpp
# Opt level: O0

Mat * pobr::imgProcessing::utils::matrixOps::forEachPixel
                (Mat *img,function<void_(const_unsigned_long_&,_const_unsigned_long_&)> *operation)

{
  unsigned_long local_28;
  uint64_t y;
  uint64_t x;
  function<void_(const_unsigned_long_&,_const_unsigned_long_&)> *operation_local;
  Mat *img_local;
  
  x = (uint64_t)operation;
  operation_local = (function<void_(const_unsigned_long_&,_const_unsigned_long_&)> *)img;
  for (y = 0; y < (ulong)(long)*(int *)((long)&(operation_local->super__Function_base)._M_functor +
                                       0xc); y = y + 1) {
    for (local_28 = 0;
        local_28 <
        (ulong)(long)*(int *)((long)&(operation_local->super__Function_base)._M_functor + 8);
        local_28 = local_28 + 1) {
      std::function<void_(const_unsigned_long_&,_const_unsigned_long_&)>::operator()
                ((function<void_(const_unsigned_long_&,_const_unsigned_long_&)> *)x,&y,&local_28);
    }
  }
  return (Mat *)operation_local;
}

Assistant:

const cv::Mat&
matrixOps::forEachPixel(
    const cv::Mat& img,
    const std::function<void(const uint64_t& x, const uint64_t& y)>& operation
)
{
    for (uint64_t x = 0; x < img.cols; x++) {
        for (uint64_t y = 0; y < img.rows; y++) {
            operation(x, y);
        }
    }

    return img;
}